

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

SuperVars * __thiscall
jsonnet::internal::Desugarer::desugarFields
          (Desugarer *this,AST *ast,ObjectFields *fields,uint obj_level)

{
  bool bVar1;
  int iVar2;
  ostream *this_00;
  undefined4 extraout_var;
  InSuper *args_6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  value_type *in_RCX;
  pointer in_RDX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  Desugarer *in_RSI;
  SuperVars *in_RDI;
  undefined1 *in_R8;
  undefined1 *puVar3;
  AST *index;
  ObjectField *field_5;
  iterator __end2_6;
  iterator __begin2_6;
  ObjectFields *__range2_6;
  uint counter;
  ObjectField *field_4;
  iterator __end2_5;
  iterator __begin2_5;
  ObjectFields *__range2_5;
  ObjectField *field_3;
  iterator __end2_4;
  iterator __begin2_4;
  ObjectFields *__range2_4;
  ObjectField *local;
  iterator __end2_3;
  iterator __begin2_3;
  ObjectFields *__range2_3;
  Binds binds;
  ObjectFields copy;
  ObjectField *field_2;
  iterator __end2_2;
  iterator __begin2_2;
  ObjectFields *__range2_2;
  AST *msg;
  ObjectField *field_1;
  iterator __end2_1;
  iterator __begin2_1;
  ObjectFields *__range2_1;
  ObjectField *field;
  iterator __end2;
  iterator __begin2;
  ObjectFields *__range2;
  SuperVars *super_vars;
  uint in_stack_000005a4;
  AST **in_stack_000005a8;
  Desugarer *in_stack_000005b0;
  undefined1 *in_stack_fffffffffffffc88;
  Bind *in_stack_fffffffffffffc90;
  value_type *in_stack_fffffffffffffc98;
  SubstituteSelfSuper *in_stack_fffffffffffffca0;
  Binary *in_stack_fffffffffffffca8;
  SuperIndex *in_stack_fffffffffffffcb0;
  LocationRange *in_stack_fffffffffffffcb8;
  LocationRange *args;
  Desugarer *in_stack_fffffffffffffcc0;
  Desugarer *this_01;
  char32_t *in_stack_fffffffffffffcc8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffcd0;
  uint *args_5;
  vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  *in_stack_fffffffffffffcd8;
  vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  *in_stack_fffffffffffffce0;
  undefined1 local_2b8 [128];
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_238;
  value_type *local_230;
  undefined4 local_228;
  undefined1 local_221;
  reference local_220;
  ObjectField *local_218;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_210;
  value_type *local_208;
  reference local_200;
  ObjectField *local_1f8;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_1f0;
  undefined1 *local_1e8;
  Desugarer local_1e0 [11];
  reference local_130;
  ObjectField *local_128;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_120;
  undefined1 *local_118;
  undefined1 local_f8 [24];
  reference local_e0;
  ObjectField *local_d8;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_d0;
  value_type *local_c8;
  undefined1 local_c0 [128];
  ObjectField *local_40;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_38 [2];
  undefined4 local_24;
  value_type *local_20;
  pointer local_18;
  
  local_24 = SUB84(in_R8,0);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_38[0]._M_current =
       (ObjectField *)
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
       begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_fffffffffffffc88);
  local_40 = (ObjectField *)
             ::std::
             vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             ::end((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                    *)in_stack_fffffffffffffc88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc88), bVar1) {
    local_c0._120_8_ =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
         ::operator*(local_38);
    if (((reference)local_c0._120_8_)->expr1 != (AST *)0x0) {
      desugar(in_stack_000005b0,in_stack_000005a8,in_stack_000005a4);
    }
    desugar(in_stack_000005b0,in_stack_000005a8,in_stack_000005a4);
    if (*(AST **)(local_c0._120_8_ + 0x100) != (AST *)0x0) {
      desugar(in_stack_000005b0,in_stack_000005a8,in_stack_000005a4);
    }
    desugarParams(in_stack_fffffffffffffcc0,(ArgParams *)in_stack_fffffffffffffcb8,
                  (uint)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(local_38);
  }
  local_c0._112_8_ = local_20;
  local_c0._104_8_ =
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
       begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_fffffffffffffc88);
  local_c0._96_8_ =
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::end
                 ((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                   *)in_stack_fffffffffffffc88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc88), bVar1) {
    local_c0._88_8_ =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
         ::operator*((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                      *)(local_c0 + 0x68));
    if (((reference)local_c0._88_8_)->kind == ASSERT) {
      local_c0._80_8_ = ((reference)local_c0._88_8_)->expr3;
      ((reference)local_c0._88_8_)->expr3 = (AST *)0x0;
      if ((LiteralString *)local_c0._80_8_ == (LiteralString *)0x0) {
        ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x35cb3c);
        ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                  (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                   (allocator<char32_t> *)in_stack_fffffffffffffcc0);
        local_c0._80_8_ =
             str((Desugarer *)in_stack_fffffffffffffca0,(LocationRange *)in_stack_fffffffffffffc98,
                 (UString *)in_stack_fffffffffffffc90);
        ::std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_fffffffffffffc90);
        ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x35cbab);
      }
      local_c0[0xf] = 1;
      local_c0._16_8_ =
           make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     ((Desugarer *)in_stack_fffffffffffffca0,
                      (LocationRange *)in_stack_fffffffffffffc98,
                      &in_stack_fffffffffffffc90->varFodder,(bool *)in_stack_fffffffffffffc88);
      local_c0._0_8_ =
           error((Desugarer *)in_stack_fffffffffffffc90,(AST *)in_stack_fffffffffffffc88);
      in_stack_fffffffffffffc90 = (Bind *)local_c0;
      in_R8 = EF;
      in_stack_fffffffffffffc88 = EF;
      in_RCX = (value_type *)
               make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralBoolean*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Error*>
                         (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffcb0,(AST **)in_stack_fffffffffffffca8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffca0,(LiteralBoolean **)in_stack_fffffffffffffc98,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffcd0,(Error **)in_stack_fffffffffffffcd8);
      *(value_type **)(local_c0._88_8_ + 0xf8) = in_RCX;
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                  *)(local_c0 + 0x68));
  }
  local_c8 = local_20;
  local_d0._M_current =
       (ObjectField *)
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
       begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_fffffffffffffc88);
  local_d8 = (ObjectField *)
             ::std::
             vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             ::end((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                    *)in_stack_fffffffffffffc88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc88), bVar1) {
    local_e0 = __gnu_cxx::
               __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
               ::operator*(&local_d0);
    if ((local_e0->methodSugar & 1U) != 0) {
      in_R8 = (undefined1 *)&local_e0->params;
      in_stack_fffffffffffffc88 = (undefined1 *)&local_e0->fodderR;
      in_stack_fffffffffffffc90 = (Bind *)&local_e0->expr2;
      in_RCX = (value_type *)
               make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                         (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffcb0,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffca8,
                          (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                           *)in_stack_fffffffffffffca0,(bool *)in_stack_fffffffffffffc98,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffcd0,(AST **)in_stack_fffffffffffffcd8);
      local_e0->expr2 = (AST *)in_RCX;
      local_e0->methodSugar = false;
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      clear((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
            0x35ce04);
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(&local_d0);
  }
  ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  vector(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  clear((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_> *)
        0x35ce38);
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *)
         0x35ce45);
  local_118 = local_f8;
  local_120._M_current =
       (ObjectField *)
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
       begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_fffffffffffffc88);
  local_128 = (ObjectField *)
              ::std::
              vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              ::end((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                     *)in_stack_fffffffffffffc88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc88), bVar1) {
    local_130 = __gnu_cxx::
                __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                ::operator*(&local_120);
    if (local_130->kind == LOCAL) {
      in_RCX = (value_type *)local_130->expr2;
      bind(local_1e0,(int)in_RSI,(sockaddr *)local_130->id,(socklen_t)in_RCX);
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::push_back((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                   *)in_stack_fffffffffffffc90,(value_type *)in_stack_fffffffffffffc88);
      Local::Bind::~Bind(in_stack_fffffffffffffc90);
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(&local_120);
  }
  local_1e8 = local_f8;
  local_1f0._M_current =
       (ObjectField *)
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
       begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_fffffffffffffc88);
  local_1f8 = (ObjectField *)
              ::std::
              vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              ::end((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                     *)in_stack_fffffffffffffc88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc88), bVar1) {
    local_200 = __gnu_cxx::
                __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                ::operator*(&local_1f0);
    if (local_200->kind != LOCAL) {
      bVar1 = ::std::
              vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
              ::empty((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                       *)in_stack_fffffffffffffca0);
      if (!bVar1) {
        in_R8 = (undefined1 *)&local_200->expr2;
        in_RCX = (value_type *)
                 make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                           ((Desugarer *)in_stack_fffffffffffffca0,
                            (LocationRange *)in_stack_fffffffffffffc98,
                            &in_stack_fffffffffffffc90->varFodder,
                            (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                             *)in_stack_fffffffffffffc88,(AST **)0x35d026);
        local_200->expr2 = (AST *)in_RCX;
      }
      ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
      ::push_back((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                   *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(&local_1f0);
  }
  local_208 = local_20;
  local_210._M_current =
       (ObjectField *)
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
       begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_fffffffffffffc88);
  local_218 = (ObjectField *)
              ::std::
              vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              ::end((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                     *)in_stack_fffffffffffffc88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc88), bVar1) {
    local_220 = __gnu_cxx::
                __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                ::operator*(&local_210);
    switch(local_220->kind) {
    case ASSERT:
      in_RCX = (value_type *)&switchD_0035d105::switchdataD_0040b8c8;
      break;
    case FIELD_ID:
      in_RCX = (value_type *)
               str((Desugarer *)in_stack_fffffffffffffca0,(LocationRange *)in_stack_fffffffffffffc98
                   ,(UString *)in_stack_fffffffffffffc90);
      local_220->expr1 = (AST *)in_RCX;
      local_220->kind = FIELD_EXPR;
      break;
    case FIELD_EXPR:
      in_RCX = (value_type *)&switchD_0035d105::switchdataD_0040b8c8;
      break;
    case FIELD_STR:
      local_220->kind = FIELD_EXPR;
      in_RCX = (value_type *)&switchD_0035d105::switchdataD_0040b8c8;
      break;
    case LOCAL:
      this_00 = ::std::operator<<((ostream *)&::std::cerr,"Locals should be removed by now.");
      ::std::ostream::operator<<(this_00,::std::endl<char,std::char_traits<char>>);
      abort();
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(&local_210);
  }
  local_221 = 0;
  ::std::
  vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  ::vector((vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
            *)0x35d1c1);
  local_228 = 0;
  local_230 = local_20;
  local_238._M_current =
       (ObjectField *)
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
       begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_fffffffffffffc88);
  local_2b8._120_8_ =
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::end
                 ((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                   *)in_stack_fffffffffffffc88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc88), bVar1) {
    local_2b8._112_8_ =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
         ::operator*(&local_238);
    if ((((reference)local_2b8._112_8_)->superSugar & 1U) != 0) {
      iVar2 = clone(in_RSI,(__fn *)((reference)local_2b8._112_8_)->expr1,__child_stack,(int)in_RCX,
                    in_R8);
      local_2b8._104_8_ = CONCAT44(extraout_var,iVar2);
      desugarFields(jsonnet::internal::AST*,std::vector<jsonnet::internal::ObjectField,std::
      allocator<jsonnet::internal::ObjectField>>&,unsigned_int)::SubstituteSelfSuper::
      SubstituteSelfSuper(jsonnet::internal::Desugarer*,std::vector<std::pair<jsonnet::internal::
      Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::
      Identifier_const*,jsonnet::internal::AST_>_>_>__unsigned_int__
                (in_stack_fffffffffffffca0,(Desugarer *)in_stack_fffffffffffffc98,
                 (SuperVars *)in_stack_fffffffffffffc90,(uint *)in_stack_fffffffffffffc88);
      CompilerPass::expr((CompilerPass *)in_stack_fffffffffffffc90,(AST **)in_stack_fffffffffffffc88
                        );
      args_5 = &local_18->indent;
      iVar2 = (int)local_2b8 + 0x68;
      puVar3 = EF;
      args_6 = make<jsonnet::internal::InSuper,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                         ((Desugarer *)in_stack_fffffffffffffcb0,
                          (LocationRange *)in_stack_fffffffffffffca8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffca0,(AST **)in_stack_fffffffffffffc98,
                          &in_stack_fffffffffffffc90->varFodder,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffc88);
      args = (LocationRange *)&local_18->indent;
      this_01 = (Desugarer *)args;
      local_2b8._48_8_ = args_6;
      iVar2 = clone(in_RSI,(__fn *)local_2b8._104_8_,__child_stack_00,iVar2,puVar3);
      local_2b8._24_8_ = CONCAT44(extraout_var_00,iVar2);
      local_2b8._16_8_ = (pointer)0x0;
      in_stack_fffffffffffffcb0 =
           make<jsonnet::internal::SuperIndex,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr)>
                     ((Desugarer *)in_stack_fffffffffffffcb0,
                      (LocationRange *)in_stack_fffffffffffffca8,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffffca0,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffffc98,(AST **)in_stack_fffffffffffffc90,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)(local_2b8 + 0x10),&this_01->alloc);
      local_2b8._12_4_ = 3;
      puVar3 = EF;
      iVar2 = (int)local_2b8 + 0x20;
      local_2b8._32_8_ = in_stack_fffffffffffffcb0;
      in_stack_fffffffffffffca8 =
           make<jsonnet::internal::Binary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::SuperIndex*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                     ((Desugarer *)in_stack_fffffffffffffcb0,
                      (LocationRange *)in_stack_fffffffffffffca8,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffffca0,(SuperIndex **)in_stack_fffffffffffffc98,
                      &in_stack_fffffffffffffc90->varFodder,(BinaryOp *)(local_2b8._112_8_ + 0xf8),
                      (AST **)this_01);
      local_2b8._40_8_ = in_stack_fffffffffffffca8;
      iVar2 = clone(in_RSI,(__fn *)*(AST **)(local_2b8._112_8_ + 0xf8),__child_stack_01,iVar2,puVar3
                   );
      in_stack_fffffffffffffca0 = (SubstituteSelfSuper *)CONCAT44(extraout_var_01,iVar2);
      in_stack_fffffffffffffc90 = (Bind *)local_2b8;
      in_R8 = EF;
      in_stack_fffffffffffffc88 = EF;
      local_2b8._0_8_ = in_stack_fffffffffffffca0;
      in_RCX = (value_type *)
               make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::InSuper*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Binary*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*>
                         (this_01,args,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffcb0,(InSuper **)in_stack_fffffffffffffca8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffca0,(Binary **)in_stack_fffffffffffffc98,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)args_5,(AST **)args_6);
      *(value_type **)(local_2b8._112_8_ + 0xf8) = in_RCX;
      *(bool *)(local_2b8._112_8_ + 0x6c) = false;
      in_stack_fffffffffffffc98 = in_RCX;
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(&local_238);
  }
  local_221 = 1;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *
          )in_stack_fffffffffffffca0);
  ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  ~vector((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_> *
          )in_stack_fffffffffffffca0);
  return in_RDI;
}

Assistant:

SuperVars desugarFields(AST *ast, ObjectFields &fields, unsigned obj_level)
    {
        // Desugar children
        for (auto &field : fields) {
            if (field.expr1 != nullptr)
                desugar(field.expr1, obj_level);
            desugar(field.expr2, obj_level + 1);
            if (field.expr3 != nullptr)
                desugar(field.expr3, obj_level + 1);
            desugarParams(field.params, obj_level + 1);
        }

        // Simplify asserts
        for (auto &field : fields) {
            if (field.kind != ObjectField::ASSERT)
                continue;
            AST *msg = field.expr3;
            field.expr3 = nullptr;
            if (msg == nullptr) {
                // The location is what appears in the stacktrace.
                msg = str(field.expr2->location, U"Object assertion failed.");
            }

            // if expr2 then true else error msg
            field.expr2 = make<Conditional>(field.expr2->location,
                                            EF,
                                            field.expr2,
                                            EF,
                                            make<LiteralBoolean>(E, EF, true),
                                            EF,
                                            error(msg));
        }

        // Remove methods
        for (auto &field : fields) {
            if (!field.methodSugar)
                continue;
            field.expr2 = make<Function>(field.expr2->location,
                                         EF,
                                         field.fodderL,
                                         field.params,
                                         field.trailingComma,
                                         field.fodderR,
                                         field.expr2);
            field.methodSugar = false;
            field.params.clear();
        }

        // Remove object-level locals
        auto copy = fields;
        fields.clear();
        Local::Binds binds;
        for (auto &local : copy) {
            if (local.kind != ObjectField::LOCAL)
                continue;
            binds.push_back(bind(local.id, local.expr2));
        }
        for (auto &field : copy) {
            if (field.kind == ObjectField::LOCAL)
                continue;
            if (!binds.empty())
                field.expr2 = make<Local>(field.expr2->location, EF, binds, field.expr2);
            fields.push_back(field);
        }

        // Change all to FIELD_EXPR
        for (auto &field : fields) {
            switch (field.kind) {
                case ObjectField::ASSERT:
                    // Nothing to do.
                    break;

                case ObjectField::FIELD_ID:
                    field.expr1 = str(field.idLocation, field.id->name);
                    field.kind = ObjectField::FIELD_EXPR;
                    break;

                case ObjectField::FIELD_EXPR:
                    // Nothing to do.
                    break;

                case ObjectField::FIELD_STR:
                    // Just set the flag.
                    field.kind = ObjectField::FIELD_EXPR;
                    break;

                case ObjectField::LOCAL:
                    std::cerr << "Locals should be removed by now." << std::endl;
                    abort();
            }
        }

        /** Replaces all occurrences of self, super[f] and e in super with variables.
         *
         * Returns all variables and original expressions via super_vars.
         */
        class SubstituteSelfSuper : public CompilerPass {
            Desugarer *desugarer;
            SuperVars &superVars;
            unsigned &counter;
            const Identifier *newSelf;

           public:
            SubstituteSelfSuper(Desugarer *desugarer, SuperVars &super_vars, unsigned &counter)
                : CompilerPass(*desugarer->alloc),
                  desugarer(desugarer),
                  superVars(super_vars),
                  counter(counter),
                  newSelf(nullptr)
            {
            }
            void visitExpr(AST *&expr)
            {
                if (dynamic_cast<Self *>(expr)) {
                    if (newSelf == nullptr) {
                        newSelf = desugarer->id(U"$outer_self");
                        superVars.emplace_back(newSelf, nullptr);
                    }
                    expr = alloc.make<Var>(expr->location, expr->openFodder, newSelf);
                } else if (auto *super_index = dynamic_cast<SuperIndex *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_super_index" << (counter++);
                    const Identifier *super_var = desugarer->id(ss.str());
                    // Desugaring of expr should already have occurred.
                    assert(super_index->index != nullptr);
                    // Re-use super_index since we're replacing it here.
                    superVars.emplace_back(super_var, super_index);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, super_var);
                } else if (auto *in_super = dynamic_cast<InSuper *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_in_super" << (counter++);
                    const Identifier *in_super_var = desugarer->id(ss.str());
                    // Re-use in_super since we're replacing it here.
                    superVars.emplace_back(in_super_var, in_super);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, in_super_var);
                }
                CompilerPass::visitExpr(expr);
            }
        };

        SuperVars super_vars;
        unsigned counter = 0;

        // Remove +:
        for (auto &field : fields) {
            if (!field.superSugar)
                continue;
            // We have to bind self/super from expr1 outside the class, as we copy the expression
            // into the field body.
            // Clone it so that we maintain the AST as a tree.
            AST *index = clone(field.expr1);
            // This will remove self/super.
            SubstituteSelfSuper(this, super_vars, counter).expr(index);
            field.expr2 = make<Conditional>(
                ast->location,
                EF,
                make<InSuper>(ast->location, EF, index, EF, EF),
                EF,
                make<Binary>(ast->location,
                             EF,
                             make<SuperIndex>(ast->location, EF, EF, clone(index), EF, nullptr),
                             EF,
                             BOP_PLUS,
                             field.expr2),
                EF,
                clone(field.expr2));
            field.superSugar = false;
        }

        return super_vars;
    }